

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::CurrentVertexAttribIntCase::test
          (CurrentVertexAttribIntCase *this)

{
  TestContext *testCtx;
  CallLogWrapper *this_00;
  deUint32 dVar1;
  GLuint index;
  int x;
  int w;
  int z;
  int y;
  int attribute_count;
  StateQueryMemoryWriteGuard<int[4]> attribValue;
  Random rnd;
  GLint local_20c;
  StateQueryMemoryWriteGuard<int[4]> local_208;
  CallLogWrapper *local_1d0;
  CurrentVertexAttribIntCase *local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  deRandom_init(&local_1c0,0xabcdef);
  local_20c = 0x10;
  local_1d0 = &(this->super_ApiCase).super_CallLogWrapper;
  local_1c8 = this;
  glu::CallLogWrapper::glGetIntegerv(local_1d0,0x8869,&local_20c);
  if (0 < local_20c) {
    index = 0;
    do {
      dVar1 = deRandom_getUint32(&local_1c0);
      x = dVar1 % 0x1f401 - 64000;
      dVar1 = deRandom_getUint32(&local_1c0);
      y = dVar1 % 0x1f401 - 64000;
      dVar1 = deRandom_getUint32(&local_1c0);
      z = dVar1 % 0x1f401 - 64000;
      dVar1 = deRandom_getUint32(&local_1c0);
      this_00 = local_1d0;
      w = dVar1 % 0x1f401 - 64000;
      glu::CallLogWrapper::glVertexAttribI4i(local_1d0,index,x,y,z,w);
      testCtx = (local_1c8->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      local_208.m_postguard[0] = -0x21212122;
      local_208.m_postguard[1] = -0x21212122;
      local_208.m_postguard[2] = -0x21212122;
      local_208.m_postguard[3] = -0x21212122;
      local_208.m_value[0] = -0x21212122;
      local_208.m_value[1] = -0x21212122;
      local_208.m_value[2] = -0x21212122;
      local_208.m_value[3] = -0x21212122;
      local_208.m_preguard[0] = -0x21212122;
      local_208.m_preguard[1] = -0x21212122;
      local_208.m_preguard[2] = -0x21212122;
      local_208.m_preguard[3] = -0x21212122;
      glu::CallLogWrapper::glGetVertexAttribIiv(this_00,index,0x8626,local_208.m_value);
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                (&local_208,testCtx);
      if ((((local_208.m_value[0] != x) || (local_208.m_value[1] != y)) ||
          (local_208.m_value[2] != z)) || (local_208.m_value[3] != w)) {
        local_1b0 = (undefined1  [8])testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"// ERROR: Expected [",0x14);
        std::ostream::operator<<(local_1a8,x);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::ostream::operator<<(local_1a8,y);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::ostream::operator<<(local_1a8,z);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::ostream::operator<<(local_1a8,w);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"];",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"got [",5);
        std::ostream::operator<<(local_1a8,local_208.m_value[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::ostream::operator<<(local_1a8,local_208.m_value[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::ostream::operator<<(local_1a8,local_208.m_value[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::ostream::operator<<(local_1a8,local_208.m_value[3]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid attribute value")
          ;
        }
      }
      index = index + 1;
    } while ((int)index < local_20c);
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		de::Random rnd(0xabcdef);

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// test write float/read float

		for (int index = 0; index < attribute_count; ++index)
		{
			const GLint x = rnd.getInt(-64000, 64000);
			const GLint y = rnd.getInt(-64000, 64000);
			const GLint z = rnd.getInt(-64000, 64000);
			const GLint w = rnd.getInt(-64000, 64000);

			glVertexAttribI4i(index, x, y, z, w);
			verifyCurrentVertexAttribIi(m_testCtx, *this, index, x, y, z, w);
		}
	}